

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

uint * GetCodeCmdCallPrologue(CodeGenRegVmContext *ctx,uint microcodePos)

{
  uint num;
  uint uVar1;
  uint uVar2;
  x86Reg reg2;
  uint *puVar3;
  uint shift;
  
  puVar3 = ctx->exRegVmConstants + microcodePos;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEBP,sQWORD,rR13,0x108);
  uVar2 = *puVar3;
  if (uVar2 != 1) {
    shift = 0;
    do {
      switch(uVar2) {
      case 2:
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,puVar3[1] << 3);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBP,shift,rEAX);
        goto LAB_001ccfec;
      case 3:
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,puVar3[1] << 3);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,rEAX);
        goto LAB_001cd0a6;
      case 4:
        EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEBP,shift,puVar3[1]);
LAB_001ccfec:
        puVar3 = puVar3 + 2;
        shift = shift + 4;
        break;
      case 5:
        uVar2 = puVar3[1];
        if ((int)uVar2 < 0) {
          EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,uVar2);
          EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,rEAX);
        }
        else {
          EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,uVar2);
        }
LAB_001cd0a6:
        puVar3 = puVar3 + 2;
        shift = shift + 8;
        break;
      case 6:
        uVar2 = puVar3[1];
        num = puVar3[2];
        uVar1 = puVar3[3];
        if (uVar2 == 3) {
          reg2 = rEBX;
LAB_001cd0d4:
          EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,reg2);
        }
        else {
          if (uVar2 == 2) {
            reg2 = rR14;
            goto LAB_001cd0d4;
          }
          if (uVar2 == 1) {
            reg2 = rR15;
            goto LAB_001cd0d4;
          }
          EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rESI,sQWORD,rEBX,uVar2 << 3);
        }
        puVar3 = puVar3 + 4;
        EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESI,num);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,shift);
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,uVar1 >> 2);
        EMIT_OP(&ctx->ctx,o_rep_movsd);
        shift = shift + uVar1;
        break;
      default:
        puVar3 = puVar3 + 1;
      }
      uVar2 = *puVar3;
    } while (uVar2 != 1);
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDX,sQWORD,rR13,0x120);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDX,0,ctx->currInstructionPos + 1);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_add64,sQWORD,rR13,0x120,4);
  return puVar3 + 1;
}

Assistant:

unsigned* GetCodeCmdCallPrologue(CodeGenRegVmContext &ctx, unsigned microcodePos)
{
	// Push arguments
	unsigned *microcode = ctx.exRegVmConstants + microcodePos;

#if defined(_M_X64)
	x86Reg rTempStack = rRBP;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempStack, sQWORD, rR13, nullcOffsetOf(ctx.vmState, dataStackTop));

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushQword:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushImm:
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushImmq:
		{
			unsigned value = *microcode++;
			if(value < 0x80000000)
			{
				EMIT_OP_RPTR_NUM(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, value);
			}
			else
			{
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, value);
				EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
			}
			tempStackPtrOffset += sizeof(long long);
		}
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			if(reg == rvrrFrame)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR15);
			else if(reg == rvrrConstants)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR14);
			else if(reg == rvrrRegisters)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rRBX);
			else
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRSI, sQWORD, rREG, reg * 8);

			EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRSI, offset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rRDI, sQWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);

			tempStackPtrOffset += size;
		}
		break;
		}
	}

	// Add call stack frame
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDX, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rRDX, nullcOffsetOf(ctx.vmState->callStackBase, instruction), ctx.currInstructionPos + 1); // vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	EMIT_OP_RPTR_NUM(ctx.ctx, o_add64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop++;
#else
	x86Reg rTempStack = rEDX;

	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rTempStack, sDWORD, uintptr_t(&ctx.vmState->dataStackTop));

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushQword:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8 + 4);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset + 4, rEAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushImm:
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushImmq:
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, *microcode++);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset + 4, 0);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_REG(ctx.ctx, o_mov, rEAX, rESI); // Save frame register
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rESI, sDWORD, rREG, reg * 8);
			EMIT_OP_REG_NUM(ctx.ctx, o_add, rESI, offset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEDI, sDWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);
			EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEAX); // Restore frame register
			EMIT_REG_READ(ctx.ctx, rESI);

			tempStackPtrOffset += size;
		}
		break;
		}
	}

	// Add call stack frame
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rECX, sDWORD, uintptr_t(&ctx.vmState->callStackTop));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, nullcOffsetOf(ctx.vmState->callStackTop, instruction), ctx.currInstructionPos + 1); // vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	EMIT_OP_RPTR_NUM(ctx.ctx, o_add, sDWORD, uintptr_t(&ctx.vmState->callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop++;

	//vmState->regFileLastTop
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rECX, sDWORD, uintptr_t(&ctx.vmState->regFileLastTop));

	//vmState->regFileLastTop[rvrrGlobals].ptrValue = uintptr_t(vmState->dataStackBase);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, rvrrGlobals * 8, uintptr_t(ctx.vmState->dataStackBase));

	//vmState->regFileLastTop[rvrrFrame].ptrValue = uintptr_t(vmState->dataStackTop);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rECX, rvrrFrame * 8, rTempStack);

	//vmState->regFileLastTop[rvrrConstants].ptrValue = uintptr_t(ctx.exRegVmConstants);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, rvrrConstants * 8, uintptr_t(ctx.exRegVmConstants));

	//vmState->regFileLastTop[rvrrRegisters].ptrValue = uintptr_t(vmState->regFileLastTop);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rECX, rvrrRegisters * 8, rECX);

	//vmState->regFileLastPtr = vmState->regFileLastTop;
	EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->regFileLastPtr), rECX);
#endif

	microcode++;

	return microcode;
}